

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.h
# Opt level: O3

void __thiscall
cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
          (ElementsConfidentialAddress *this)

{
  if (*(ElementsConfidentialAddress **)(this + 400) != this + 0x1a0) {
    operator_delete(*(ElementsConfidentialAddress **)(this + 400));
  }
  if (*(void **)(this + 0x178) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x178));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(this + 0x148));
  Script::~Script((Script *)(this + 0x108));
  *(code **)(this + 0x78) = cfd::core::Privkey::Privkey;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (this + 0xf0));
  TapBranch::~TapBranch((TapBranch *)(this + 0x78));
  if (*(void **)(this + 0x60) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x60));
  }
  if (*(void **)(this + 0x48) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x48));
  }
  if (*(void **)(this + 0x30) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x30));
  }
  if (*(ElementsConfidentialAddress **)(this + 0x10) != this + 0x20) {
    operator_delete(*(ElementsConfidentialAddress **)(this + 0x10));
    return;
  }
  return;
}

Assistant:

class CFD_CORE_EXPORT ElementsConfidentialAddress {
 public:
  /**
   * @brief get default blinding key.
   * @param[in] master_blinding_key master blindingKey
   * @param[in] locking_script      locking script by address.
   * @return blinding key
   */
  static Privkey GetBlindingKey(
      const Privkey& master_blinding_key, const Script& locking_script);

  /**
   * @brief default constructor.
   */
  ElementsConfidentialAddress();

  /**
   * @brief constructor. (Generate Confidential Address from Unblinded Address)
   * @param unblinded_address UnblindedAddress instance
   * @param confidential_key  ConfidentialKey instance
   */
  explicit ElementsConfidentialAddress(
      const Address& unblinded_address,
      const ConfidentialKey& confidential_key);

  /**
   * @brief constructor. (Decoding from the ConfidentialAddress string)
   * @param[in] confidential_address confidential address string.
   */
  explicit ElementsConfidentialAddress(
      const std::string& confidential_address);

  /**
   * @brief constructor. (Decoding from the ConfidentialAddress string)
   * @param[in] confidential_address confidential address string.
   * @param[in] prefix_list  address prefix list
   */
  explicit ElementsConfidentialAddress(
      const std::string& confidential_address,
      const std::vector<AddressFormatData>& prefix_list);
  /**
   * @brief copy constructor.
   * @param[in] object    object
   */
  ElementsConfidentialAddress(const ElementsConfidentialAddress& object);
  /**
   * @brief copy constructor.
   * @param[in] object    object
   * @return object
   */
  ElementsConfidentialAddress& operator=(
      const ElementsConfidentialAddress& object) &;

  /**
   * @brief Get UnblindedAddress
   * @return UnblindedAddress instance associated with ConfidentialAddress
   */
  Address GetUnblindedAddress() const;

  /**
   * @brief Get Confidential Key
   * @return Confidential Key instance associated with Confidential Address
   */
  ConfidentialKey GetConfidentialKey() const;

  /**
   * @brief Get the address string.
   * @return address string.
   */
  std::string GetAddress() const;

  /**
   * @brief Get the ElementsNetType of Address.
   * @return ElementsNetType
   */
  ElementsNetType GetNetType() const;

  /**
   * @brief Get the Address type.
   * @return Address type.
   */
  ElementsAddressType GetAddressType() const;

  /**
   * @brief Get the address Hash.
   * @return address Hash.
   */
  ByteData GetHash() const;

  /**
   * @brief Get LockingScript
   * @return locking script
   */
  Script GetLockingScript() const;

  /**
   * @brief Determines if the specified address is a Blinded address
   * @param address     address string
   * @retval true   has blind address
   * @retval false  not blind address
   */
  static bool IsConfidentialAddress(const std::string& address);

  /**
   * @brief Determines if the specified address is a Blinded address
   * @param[in] address     address string
   * @param[in] prefix_list     address prefix list
   * @retval true   has blind address
   * @retval false  not blind address
   */
  static bool IsConfidentialAddress(
      const std::string& address,
      const std::vector<AddressFormatData>& prefix_list);

 private:
  /**
   * @brief Decode the model from the confidential address string
   * @param[in] confidential_address  confidential address string
   * @param[in] prefix_list           address prefix list
   */
  void DecodeAddress(
      const std::string& confidential_address,
      const std::vector<AddressFormatData>& prefix_list);

  /**
   * @brief Calculate the confidential_address from the unblinded_address and confidential_key.
   * @details For the network type of Elements, the calculation is performed \
   *   on the same type of network as connected_address.
   * @param unblinded_address UnblindedAddress
   * @param confidential_key Confidential Key instance used for Blind
   */
  void CalculateAddress(
      const Address& unblinded_address,
      const ConfidentialKey& confidential_key);

  /// Unblinded Address
  Address unblinded_address_;

  /// Confidential Key
  ConfidentialKey confidential_key_;

  /// address string
  std::string address_;
}